

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

uint64_t reverse_bits_64(uint64_t x,int n)

{
  uint64_t uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
          (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
          (x & 0xff00) << 0x28 | x << 0x38;
  uVar2 = 4;
  for (uVar3 = 2; n <= (int)uVar3; uVar3 = uVar3 - 1) {
    uVar1 = uVar1 >> (sbyte)uVar2 & even_bit_esz_masks[uVar3] |
            (even_bit_esz_masks[uVar3] & uVar1) << (sbyte)uVar2;
    uVar2 = uVar2 >> 1;
  }
  return uVar1;
}

Assistant:

static uint64_t reverse_bits_64(uint64_t x, int n)
{
    int i, sh;

    x = bswap64(x);
    for (i = 2, sh = 4; i >= n; i--, sh >>= 1) {
        uint64_t mask = even_bit_esz_masks[i];
        x = ((x & mask) << sh) | ((x >> sh) & mask);
    }
    return x;
}